

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QGraphicsItemPrivate::clearSubFocus
          (QGraphicsItemPrivate *this,QGraphicsItem *rootItem,QGraphicsItem *stopItem)

{
  QGraphicsItemPrivate *pQVar1;
  bool bVar2;
  
  if (rootItem == (QGraphicsItem *)0x0) {
    rootItem = this->q_ptr;
  }
  while( true ) {
    pQVar1 = (rootItem->d_ptr).d;
    if (pQVar1->subFocusItem != this->q_ptr) {
      return;
    }
    pQVar1->subFocusItem = (QGraphicsItem *)0x0;
    if ((rootItem != stopItem) && (bVar2 = QGraphicsItem::isAncestorOf(rootItem,stopItem), !bVar2))
    {
      (*((rootItem->d_ptr).d)->_vptr_QGraphicsItemPrivate[8])();
    }
    pQVar1 = (rootItem->d_ptr).d;
    if ((pQVar1->field_0x165 & 0x40) != 0) break;
    rootItem = pQVar1->parent;
    if (rootItem == (QGraphicsItem *)0x0) {
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::clearSubFocus(QGraphicsItem *rootItem, QGraphicsItem *stopItem)
{
    // Reset sub focus chain.
    QGraphicsItem *parent = rootItem ? rootItem : q_ptr;
    do {
        if (parent->d_ptr->subFocusItem != q_ptr)
            break;
        parent->d_ptr->subFocusItem = nullptr;
        if (parent != stopItem && !parent->isAncestorOf(stopItem))
            parent->d_ptr->subFocusItemChange();
    } while (!parent->isPanel() && (parent = parent->d_ptr->parent));
}